

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

xmlChar * xmlSplitQName4(xmlChar *name,xmlChar **prefixPtr)

{
  xmlChar xVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  int len;
  
  if (prefixPtr == (xmlChar **)0x0 || name == (xmlChar *)0x0) {
LAB_0014ae44:
    name = (xmlChar *)0x0;
  }
  else {
    *prefixPtr = (xmlChar *)0x0;
    xVar1 = *name;
    if (xVar1 != ':') {
      len = 0;
      pxVar3 = name + 1;
      while (xVar1 != '\0') {
        if (xVar1 == ':') {
          if (*pxVar3 == '\0') {
            return name;
          }
          pxVar2 = xmlStrndup(name,len);
          if (pxVar2 != (xmlChar *)0x0) {
            *prefixPtr = pxVar2;
            return pxVar3;
          }
          goto LAB_0014ae44;
        }
        len = len + 1;
        xVar1 = *pxVar3;
        pxVar3 = pxVar3 + 1;
      }
    }
  }
  return name;
}

Assistant:

const xmlChar *
xmlSplitQName4(const xmlChar *name, xmlChar **prefixPtr) {
    xmlChar *prefix;
    int l = 0;

    if ((name == NULL) || (prefixPtr == NULL))
        return(NULL);

    *prefixPtr = NULL;

    /* nasty but valid */
    if (name[0] == ':')
	return(name);

    /*
     * we are not trying to validate but just to cut, and yes it will
     * work even if this is as set of UTF-8 encoded chars
     */
    while ((name[l] != 0) && (name[l] != ':'))
	l++;

    /*
     * TODO: What about names with multiple colons?
     */
    if ((name[l] == 0) || (name[l+1] == 0))
	return(name);

    prefix = xmlStrndup(name, l);
    if (prefix == NULL)
        return(NULL);

    *prefixPtr = prefix;
    return(&name[l+1]);
}